

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O3

void __thiscall
m2d::savanna::ssl_reuse::
https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::on_write_l(https_logic<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
             *this,error_code ec,size_t bytes_transferred)

{
  ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>
  *s;
  element_type *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_c0;
  bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
  local_b0;
  stable_async_base<boost::beast::detail::bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_std::allocator<void>_>
  local_90;
  
  s = (this->ssl_stream_).
      super___shared_ptr<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_boost::beast::unlimited_rate_policy>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr;
  std::__shared_ptr<m2d::savanna::ssl_reuse::interface,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<m2d::savanna::ssl_reuse::interface,void>
            ((__shared_ptr<m2d::savanna::ssl_reuse::interface,(__gnu_cxx::_Lock_policy)2> *)
             &local_c8,
             (__weak_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_interface).
              super_enable_shared_from_this<m2d::savanna::ssl_reuse::interface>);
  local_b0.h_ = (offset_in_interface_to_subr)ssl_reuse::interface::on_read;
  local_b0._8_8_ = 0;
  local_b0.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>.t.
  super___shared_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_c8;
  local_b0.args_.
  super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
  .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>.t.
  super___shared_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Stack_c0;
  local_c8 = (element_type *)0x0;
  p_Stack_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  boost::beast::http::detail::
  read_msg_op<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,boost::beast::basic_flat_buffer<std::allocator<char>>,false,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,std::allocator<char>,boost::beast::detail::bind_front_wrapper<void(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,unsigned_long),std::shared_ptr<m2d::savanna::ssl_reuse::interface>>>
  ::
  read_msg_op<boost::beast::detail::bind_front_wrapper<void(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,unsigned_long),std::shared_ptr<m2d::savanna::ssl_reuse::interface>>>
            ((read_msg_op<boost::beast::ssl_stream<boost::beast::basic_stream<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>,boost::beast::unlimited_rate_policy>>,boost::beast::basic_flat_buffer<std::allocator<char>>,false,boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>,std::allocator<char>,boost::beast::detail::bind_front_wrapper<void(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,unsigned_long),std::shared_ptr<m2d::savanna::ssl_reuse::interface>>>
              *)&local_90,&local_b0,s,&this->buffer_,&this->response_);
  boost::beast::
  stable_async_base<boost::beast::detail::bind_front_wrapper<void_(m2d::savanna::ssl_reuse::interface::*)(boost::system::error_code,_unsigned_long),_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>,_std::allocator<void>_>
  ::~stable_async_base(&local_90);
  if (local_b0.args_.
      super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
      .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>.t.
      super___shared_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.args_.
               super_tuple_impl<boost::mp11::integer_sequence<unsigned_long,_0UL>,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>
               .super_tuple_element_impl<0UL,_std::shared_ptr<m2d::savanna::ssl_reuse::interface>_>.
               t.super___shared_ptr<m2d::savanna::ssl_reuse::interface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_c0);
  }
  return;
}

Assistant:

void on_write_l(beast::error_code ec, std::size_t bytes_transferred) override {
			http::async_read(*ssl_stream_, buffer_, response_, beast::bind_front_handler(&https_logic<Body>::on_read, this->shared_from_this()));
		}